

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_sCAL_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,int *unit,
                  png_fixed_point *width,png_fixed_point *height)

{
  png_fixed_point pVar1;
  double dVar2;
  png_fixed_point *height_local;
  png_fixed_point *width_local;
  int *unit_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     ((info_ptr->valid & 0x4000) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    *unit = (uint)info_ptr->scal_unit;
    dVar2 = atof(info_ptr->scal_s_width);
    pVar1 = png_fixed(png_ptr,dVar2,"sCAL width");
    *width = pVar1;
    dVar2 = atof(info_ptr->scal_s_height);
    pVar1 = png_fixed(png_ptr,dVar2,"sCAL height");
    *height = pVar1;
    png_ptr_local._4_4_ = 0x4000;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_sCAL_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *unit, png_fixed_point *width, png_fixed_point *height)
{
   png_debug1(1, "in %s retrieval function", "sCAL");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      *unit = info_ptr->scal_unit;
      /*TODO: make this work without FP support; the API is currently eliminated
       * if neither floating point APIs nor internal floating point arithmetic
       * are enabled.
       */
      *width = png_fixed(png_ptr, atof(info_ptr->scal_s_width), "sCAL width");
      *height = png_fixed(png_ptr, atof(info_ptr->scal_s_height),
          "sCAL height");
      return PNG_INFO_sCAL;
   }

   return 0;
}